

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.h
# Opt level: O0

void __thiscall
OrderMoney::OrderMoney<std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
          (OrderMoney *this,string *currency,shared_ptr<const_Bank> *bank,
          shared_ptr<RealMoney> *money,shared_ptr<RealMoney> *money_1)

{
  shared_ptr<ExchangedMoney> local_70;
  shared_ptr<const_Money> local_60;
  shared_ptr<ExchangedMoney> local_50;
  shared_ptr<const_Money> local_40;
  shared_ptr<RealMoney> *local_30;
  shared_ptr<RealMoney> *money_local_1;
  shared_ptr<RealMoney> *money_local;
  shared_ptr<const_Bank> *bank_local;
  string *currency_local;
  OrderMoney *this_local;
  
  local_30 = money_1;
  money_local_1 = money;
  money_local = (shared_ptr<RealMoney> *)bank;
  bank_local = (shared_ptr<const_Bank> *)currency;
  currency_local = (string *)this;
  std::
  make_shared<ExchangedMoney,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            ((shared_ptr<RealMoney> *)&local_50,(shared_ptr<const_Bank> *)money,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bank);
  std::shared_ptr<Money_const>::shared_ptr<ExchangedMoney,void>
            ((shared_ptr<Money_const> *)&local_40,&local_50);
  std::
  make_shared<ExchangedMoney,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            ((shared_ptr<RealMoney> *)&local_70,(shared_ptr<const_Bank> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)money_local);
  std::shared_ptr<Money_const>::shared_ptr<ExchangedMoney,void>
            ((shared_ptr<Money_const> *)&local_60,&local_70);
  OrderMoney(this,&local_40,&local_60);
  std::shared_ptr<const_Money>::~shared_ptr(&local_60);
  std::shared_ptr<ExchangedMoney>::~shared_ptr(&local_70);
  std::shared_ptr<const_Money>::~shared_ptr(&local_40);
  std::shared_ptr<ExchangedMoney>::~shared_ptr(&local_50);
  return;
}

Assistant:

OrderMoney(
		const std::string &currency,
		const std::shared_ptr<const Bank> &bank,
		const T & ... money
	) : OrderMoney(std::make_shared<ExchangedMoney>(money, bank, currency)...)
	{
	}